

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::lower_upper_bound_dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this)

{
  type_conflict3 tVar1;
  int iVar2;
  int iVar3;
  Simplex_handle local_98;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0;
  Complex_simplex_range local_60;
  
  this->dimension_to_be_lowered_ = false;
  complex_simplex_range(&local_60,this);
  __begin0.sh_.m_ptr =
       local_60.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sh_.m_ptr;
  __begin0.sib_ =
       local_60.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.sib_;
  __begin0.st_ = local_60.
                 super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin.st_;
  __end0.sh_.m_ptr =
       local_60.
       super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End.sh_.m_ptr;
  __end0.sib_ = local_60.
                super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                .m_End.sib_;
  __end0.st_ = local_60.
               super_iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.st_;
  iVar3 = -1;
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__begin0,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0);
    if (!tVar1) break;
    local_98.m_ptr = __begin0.sh_.m_ptr;
    iVar2 = dimension(this,&local_98);
    if (this->dimension_ <= iVar2) goto LAB_0011486d;
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
    ::increment(&__begin0);
  }
  this->dimension_ = iVar3;
LAB_0011486d:
  return !tVar1;
}

Assistant:

bool lower_upper_bound_dimension() const {
    // reset automatic detection to recompute
    dimension_to_be_lowered_ = false;
    int new_dimension = -1;
    // Browse the tree from the left to the right as higher dimension cells are more likely on the left part of the tree
    for (Simplex_handle sh : complex_simplex_range()) {
#ifdef DEBUG_TRACES
      for (auto vertex : simplex_vertex_range(sh)) {
        std::clog << " " << vertex;
      }
      std::clog << std::endl;
#endif  // DEBUG_TRACES

      int sh_dimension = dimension(sh);
      if (sh_dimension >= dimension_)
        // Stop browsing as soon as the dimension is reached, no need to go further
        return false;
      new_dimension = (std::max)(new_dimension, sh_dimension);
    }
    dimension_ = new_dimension;
    return true;
  }